

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O2

pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
* __thiscall
hanabi_learning_env::HanabiState::ChanceOutcomes
          (pair<std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,HanabiState *this)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  HanabiMove move;
  HanabiMove local_40;
  double local_38;
  
  (__return_storage_ptr__->second).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->second).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->first).
  super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = HanabiGame::MaxChanceOutcomes(this->parent_game_);
  uVar3 = 0;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    local_40 = (this->parent_game_->chance_outcomes_).
               super__Vector_base<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar3];
    bVar1 = MoveIsLegal(this,local_40);
    if (bVar1) {
      std::vector<hanabi_learning_env::HanabiMove,_std::allocator<hanabi_learning_env::HanabiMove>_>
      ::push_back(&__return_storage_ptr__->first,&local_40);
      local_38 = ChanceOutcomeProb(this,local_40);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>
                (&__return_storage_ptr__->second,&local_38);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<HanabiMove>, std::vector<double>>
HanabiState::ChanceOutcomes() const {
  std::pair<std::vector<HanabiMove>, std::vector<double>> rv;
  int max_outcome_uid = ParentGame()->MaxChanceOutcomes();
  for (int uid = 0; uid < max_outcome_uid; ++uid) {
    HanabiMove move = ParentGame()->GetChanceOutcome(uid);
    if (MoveIsLegal(move)) {
      rv.first.push_back(move);
      rv.second.push_back(ChanceOutcomeProb(move));
    }
  }
  return rv;
}